

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

BlockAddressed * __thiscall
Network::RecvBlock(BlockAddressed *__return_storage_ptr__,Network *this,network_address_t dst)

{
  mutex *__mutex;
  int iVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  iterator __position;
  list<BlockAddressed,_std::allocator<BlockAddressed>_> *this_01;
  
  __mutex = &this->_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar2 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  this_01 = &this->_blocks;
  __position._M_node = (_List_node_base *)this_01;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_01) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"no block for you");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (*(int *)((long)&__position._M_node[1]._M_next + 4) != dst);
  *(_List_node_base **)__return_storage_ptr__ = __position._M_node[1]._M_next;
  Block::Block(&__return_storage_ptr__->bk,(Block *)&__position._M_node[1]._M_prev);
  std::__cxx11::list<BlockAddressed,_std::allocator<BlockAddressed>_>::_M_erase(this_01,__position);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

BlockAddressed Network::RecvBlock(network_address_t dst) {
  std::lock_guard<std::mutex> guard(_mutex);
  for (auto it = _blocks.begin(); it !=_blocks.end(); ++it)
  {
    if(it->dst == dst)
    {
      auto bk = *it;
      _blocks.erase(it);
      return bk;
    }
  }
  throw std::runtime_error("no block for you");
}